

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.cpp
# Opt level: O1

string * __thiscall
duckdb::TableFunctionRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TableFunctionRelation *this,idx_t depth)

{
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  reference this_00;
  long *plVar4;
  size_type *psVar5;
  idx_t depth_00;
  size_type __n;
  string function_call;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  Relation *local_40;
  string *local_38;
  
  local_80[0] = local_70;
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_40 = (Relation *)depth;
  local_38 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + (this->name)._M_string_length);
  ::std::__cxx11::string::append((char *)local_80);
  if ((this->parameters).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->parameters).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)local_80);
      }
      this_00 = vector<duckdb::Value,_true>::operator[](&this->parameters,__n);
      Value::ToString_abi_cxx11_(&local_60,this_00);
      ::std::__cxx11::string::_M_append((char *)local_80,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->parameters).
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->parameters).
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 6));
  }
  ::std::__cxx11::string::append((char *)local_80);
  Relation::RenderWhitespace_abi_cxx11_(&local_60,local_40,depth_00);
  psVar3 = local_38;
  plVar4 = (long *)::std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80[0]);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (psVar3->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&psVar3->field_2 + 8) = lVar2;
  }
  else {
    (psVar3->_M_dataplus)._M_p = (pointer)*plVar4;
    (psVar3->field_2)._M_allocated_capacity = *psVar5;
  }
  psVar3->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  return psVar3;
}

Assistant:

string TableFunctionRelation::ToString(idx_t depth) {
	string function_call = name + "(";
	for (idx_t i = 0; i < parameters.size(); i++) {
		if (i > 0) {
			function_call += ", ";
		}
		function_call += parameters[i].ToString();
	}
	function_call += ")";
	return RenderWhitespace(depth) + function_call;
}